

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::DefaultSampling<tcu::Matrix<float,_2,_2>_>::genFixeds
          (DefaultSampling<tcu::Matrix<float,_2,_2>_> *this,FloatFormat *fmt,
          vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_> *dst)

{
  ulong uVar1;
  vector<float,_std::allocator<float>_> scalars;
  Matrix<float,_2,_2> local_48;
  vector<float,_std::allocator<float>_> local_38;
  
  local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  DefaultSampling<float>::genFixeds((DefaultSampling<float> *)this,fmt,&local_38);
  if (local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar1 = 0;
    do {
      local_48.m_data.m_data[0].m_data[0] =
           local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[uVar1];
      local_48.m_data.m_data[0].m_data[1] = 0.0;
      local_48.m_data.m_data[1].m_data[0] = 0.0;
      local_48.m_data.m_data[1].m_data[1] =
           local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[uVar1];
      std::vector<tcu::Matrix<float,2,2>,std::allocator<tcu::Matrix<float,2,2>>>::
      emplace_back<tcu::Matrix<float,2,2>>
                ((vector<tcu::Matrix<float,2,2>,std::allocator<tcu::Matrix<float,2,2>>> *)dst,
                 &local_48);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (ulong)((long)local_38.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_38.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  local_48.m_data.m_data[1].m_data[0] = 1.0;
  local_48.m_data.m_data[1].m_data[1] = 0.0;
  local_48.m_data.m_data[0].m_data[0] = 1.0;
  local_48.m_data.m_data[0].m_data[1] = 2.0;
  std::vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>::push_back
            (dst,&local_48);
  if (local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void	genFixeds	(const FloatFormat& fmt, vector<Value>& dst) const
	{
		vector<T> scalars;

		instance<DefaultSampling<T> >().genFixeds(fmt, scalars);

		for (size_t scalarNdx = 0; scalarNdx < scalars.size(); ++scalarNdx)
			dst.push_back(Value(scalars[scalarNdx]));

		if (Columns == Rows)
		{
			Value	mat	(0.0);
			T		x	= T(1.0f);
			mat[0][0] = x;
			for (int ndx = 0; ndx < Columns; ++ndx)
			{
				mat[Columns-1-ndx][ndx] = x;
				x *= T(2.0f);
			}
			dst.push_back(mat);
		}
	}